

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintOldCustomModules(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  char *format;
  char *pcVar3;
  string name;
  string ext;
  string filename;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&this->CurrentArgument);
  cmsys::SystemTools::GetFilenameLastExtension(&local_90,&local_30);
  cmsys::SystemTools::UpperCase(&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_90,&local_30);
  bVar1 = std::operator==(&local_70,".HTM");
  if (bVar1) {
LAB_0038d369:
    poVar2 = std::operator<<(os,"<html><title>");
    poVar2 = std::operator<<(poVar2,(string *)&local_90);
    poVar2 = std::operator<<(poVar2,"</title><body>\n");
    poVar2 = std::operator<<(poVar2,"cmake --help-custom-modules no longer supported\n");
    poVar2 = std::operator<<(poVar2,"<p/>\n");
    poVar2 = std::operator<<(poVar2,
                             "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
                            );
    pcVar3 = "</body></html>\n";
  }
  else {
    bVar1 = std::operator==(&local_70,".HTML");
    if (bVar1) goto LAB_0038d369;
    if ((local_70._M_string_length == 2) && ((byte)(local_70._M_dataplus._M_p[1] - 0x31U) < 9)) {
      poVar2 = std::operator<<(os,".TH ");
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,local_70._M_dataplus._M_p[1]);
      poVar2 = std::operator<<(poVar2," \"");
      cmsys::SystemTools::GetCurrentDateTime_abi_cxx11_(&local_50,(SystemTools *)"%B %d, %Y",format)
      ;
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,"\" \"cmake ");
      pcVar3 = cmVersion::GetCMakeVersion();
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,"\"\n.SH NAME\n.PP\n");
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      poVar2 = std::operator<<(poVar2," \\- ");
      poVar2 = std::operator<<(poVar2,"cmake --help-custom-modules no longer supported\n");
      poVar2 = std::operator<<(poVar2,"\n.SH DESCRIPTION\n.PP\n");
      std::operator<<(poVar2,
                      "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
                     );
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0038d526;
    }
    poVar2 = std::operator<<(os,(string *)&local_90);
    poVar2 = std::operator<<(poVar2,"\n\n");
    poVar2 = std::operator<<(poVar2,"cmake --help-custom-modules no longer supported\n");
    poVar2 = std::operator<<(poVar2,"\n");
    pcVar3 = 
    "CMake versions prior to 3.0 exposed their internal module help page\ngeneration functionality through the --help-custom-modules option.\nCMake versions 3.0 and above use other means to generate their module\nhelp pages so this functionality is no longer available to be exposed.\n\nThis file was generated as a placeholder to provide this information.\n"
    ;
  }
  std::operator<<(poVar2,pcVar3);
LAB_0038d526:
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

bool cmDocumentation::PrintOldCustomModules(std::ostream& os)
{
  // CheckOptions abuses the Argument field to give us the file name.
  std::string filename = this->CurrentArgument;
  std::string ext = cmSystemTools::UpperCase(
    cmSystemTools::GetFilenameLastExtension(filename));
  std::string name = cmSystemTools::GetFilenameWithoutLastExtension(filename);

  const char* summary = "cmake --help-custom-modules no longer supported\n";
  const char* detail =
    "CMake versions prior to 3.0 exposed their internal module help page\n"
    "generation functionality through the --help-custom-modules option.\n"
    "CMake versions 3.0 and above use other means to generate their module\n"
    "help pages so this functionality is no longer available to be exposed.\n"
    "\n"
    "This file was generated as a placeholder to provide this information.\n";
  if ((ext == ".HTM") || (ext == ".HTML")) {
    os << "<html><title>" << name << "</title><body>\n"
       << summary << "<p/>\n"
       << detail << "</body></html>\n";
  } else if ((ext.length() == 2) && (ext[1] >= '1') && (ext[1] <= '9')) {
    /* clang-format off */
    os <<
      ".TH " << name << " " << ext[1] << " \"" <<
      cmSystemTools::GetCurrentDateTime("%B %d, %Y") <<
      "\" \"cmake " << cmVersion::GetCMakeVersion() << "\"\n"
      ".SH NAME\n"
      ".PP\n" <<
      name << " \\- " << summary <<
      "\n"
      ".SH DESCRIPTION\n"
      ".PP\n" <<
      detail
      ;
    /* clang-format on */
  } else {
    os << name << "\n\n" << summary << "\n" << detail;
  }
  return true;
}